

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindPureFunctions::operator()(FindPureFunctions *this,FuncDecl *node)

{
  shared_ptr<mocker::ast::ASTNode> local_28;
  FuncDecl *local_18;
  FuncDecl *node_local;
  FindPureFunctions *this_local;
  
  local_18 = node;
  node_local = (FuncDecl *)this;
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::CompoundStmt,void>
            (&local_28,&node->body);
  visit(this,&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  return;
}

Assistant:

void operator()(const ast::FuncDecl &node) const override {
    visit(node.body);
  }